

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v4::bone_io::import_ikdata(bone_io *this,xr_reader *r)

{
  uint32_t uVar1;
  float fVar2;
  uint32_t version;
  xr_reader *r_local;
  bone_io *this_local;
  
  uVar1 = xr_reader::r_u32(r);
  if (uVar1 == 1) {
    xr_reader::r_sz(r,&(this->super_xr_bone).m_gamemtl);
    xr_reader::r<xray_re::s_bone_shape>(r,&(this->super_xr_bone).m_shape);
    xr_reader::r<xray_re::s_joint_ik_data>(r,&(this->super_xr_bone).m_joint_ik_data);
    xr_reader::r_fvector3(r,&(this->super_xr_bone).m_bind_rotate);
    xr_reader::r_fvector3(r,&(this->super_xr_bone).m_bind_offset);
    (this->super_xr_bone).m_bind_length = 0.5;
    fVar2 = xr_reader::r_float(r);
    (this->super_xr_bone).m_mass = fVar2;
    xr_reader::r_fvector3(r,&(this->super_xr_bone).m_center_of_mass);
    return;
  }
  __assert_fail("version == OGF4_S_JOINT_IK_DATA_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                ,0x1c3,"void xray_re::xr_ogf_v4::bone_io::import_ikdata(xr_reader &)");
}

Assistant:

inline void xr_ogf_v4::bone_io::import_ikdata(xr_reader& r)
{
	uint32_t version = r.r_u32();
	xr_assert(version == OGF4_S_JOINT_IK_DATA_VERSION);
	r.r_sz(m_gamemtl);
	r.r(m_shape);
	r.r(m_joint_ik_data);
	r.r_fvector3(m_bind_rotate);
	r.r_fvector3(m_bind_offset);
	m_bind_length = 0.5f;
	m_mass = r.r_float();
	r.r_fvector3(m_center_of_mass);
}